

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O1

char * opensshcert_alternate_ssh_id(ssh_keyalg *self,uint flags)

{
  ssh_keyalg *psVar1;
  int iVar2;
  char *__s1;
  ulong uVar3;
  ssh_keyalg **ppsVar4;
  char *unaff_R14;
  bool bVar5;
  
  __s1 = (*self->base_alg->alternate_ssh_id)(self->base_alg,flags);
  ppsVar4 = opensshcert_all_keyalgs;
  bVar5 = false;
  uVar3 = 0;
  do {
    psVar1 = *ppsVar4;
    iVar2 = strcmp(__s1,psVar1->base_alg->ssh_id);
    if (iVar2 == 0) {
      unaff_R14 = psVar1->ssh_id;
      break;
    }
    bVar5 = 6 < uVar3;
    uVar3 = uVar3 + 1;
    ppsVar4 = ppsVar4 + 1;
  } while (uVar3 != 8);
  if (bVar5) {
    unaff_R14 = self->ssh_id;
  }
  return unaff_R14;
}

Assistant:

static const char *opensshcert_alternate_ssh_id(const ssh_keyalg *self,
                                                unsigned flags)
{
    const char *base_id = ssh_keyalg_alternate_ssh_id(self->base_alg, flags);

    for (size_t i = 0; i < lenof(opensshcert_all_keyalgs); i++) {
        const ssh_keyalg *alg_i = opensshcert_all_keyalgs[i];
        if (!strcmp(base_id, alg_i->base_alg->ssh_id))
            return alg_i->ssh_id;
    }

    return self->ssh_id;
}